

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr64.cpp
# Opt level: O2

UBool __thiscall icu_63::UVector64::operator==(UVector64 *this,UVector64 *other)

{
  long *plVar1;
  long *plVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar3 = this->count;
  uVar4 = 0;
  if (uVar3 == other->count) {
    uVar5 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar5 = uVar4;
    }
    do {
      if (uVar5 == uVar4) {
        return '\x01';
      }
      plVar1 = this->elements + uVar4;
      plVar2 = other->elements + uVar4;
      uVar4 = uVar4 + 1;
    } while (*plVar1 == *plVar2);
  }
  return '\0';
}

Assistant:

UBool UVector64::operator==(const UVector64& other) {
    int32_t i;
    if (count != other.count) return FALSE;
    for (i=0; i<count; ++i) {
        if (elements[i] != other.elements[i]) {
            return FALSE;
        }
    }
    return TRUE;
}